

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O2

HRESULT ExecuteTest(char *fileName)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  HRESULT HVar4;
  JsErrorCode JVar5;
  HRESULT HVar6;
  size_t sVar7;
  PAL_FILE *pPVar8;
  LPCWSTR pWVar9;
  Debugger *this;
  char *pcVar10;
  undefined8 uVar11;
  char16_t *pcVar12;
  char *pcVar13;
  JsContextRef local_158;
  char fullPath [260];
  uint local_4c;
  LPCSTR pCStack_48;
  uint rcount;
  LPCSTR fileContents;
  JsRuntimeHandle pvStack_38;
  UINT lengthBytes;
  JsRuntimeHandle runtime;
  
  pCStack_48 = (LPCSTR)0x0;
  pvStack_38 = (JsRuntimeHandle)0x0;
  fileContents._4_4_ = 0;
  sVar7 = strlen(fileName);
  if ((0xd < sVar7) && (iVar3 = strcmp(fileName + (sVar7 - 0xe),"ttdSentinal.js"), iVar3 == 0)) {
    if (doTTReplay == 0) {
      PAL_wprintf(L"Sentinel js file is only ok when in TTReplay mode!!!\n");
      return -0x7fffbffb;
    }
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    HVar6 = 0;
    JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateReplayRuntime)
                      (jsrtAttributes,ttUri,ttUriLength,false,Helpers::TTCreateStreamCallback,
                       Helpers::TTReadBytesFromStreamCallback,Helpers::TTFlushAndCloseStreamCallback
                       ,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
    if (JVar5 == JsNoError) {
      chRuntime = pvStack_38;
      local_158 = (JsContextRef)0x0;
      JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)(pvStack_38,true,&local_158);
      if (JVar5 == JsNoError) {
        JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar5 == JsNoError) {
          HVar6 = RunScript(fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                            (JsValueRef)0x0,(char *)0x0,(JsValueRef)0x0);
          if (HVar6 < 0) goto LAB_001089f0;
          local_4c = 0;
          JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
          if (JVar5 == JsNoError) {
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(local_158,&local_4c);
            if (local_4c != 0) {
              pPVar8 = PAL_get_stderr(0);
              pcVar13 = "rcount == 0";
              pcVar10 = 
              "Should only have had 1 ref from replay code and one ref from current context??";
              uVar11 = 0x326;
              goto LAB_00108c8d;
            }
            goto LAB_001089f0;
          }
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar5);
          pcVar12 = 
          L"ERROR: ChakraRTInterface::JsSetCurrentContext(nullptr) failed. JsErrorCode=0x%x (%s)\n";
        }
        else {
          HVar6 = 0;
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar5);
          pcVar12 = 
          L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
        }
      }
      else {
        HVar6 = 0;
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar5);
        pcVar12 = 
        L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar5);
      pcVar12 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar8,pcVar12,(ulong)JVar5,pWVar9);
    pPVar8 = PAL_get_stderr(0);
    PAL_fflush(pPVar8);
    goto LAB_001089f0;
  }
  HVar4 = Helpers::LoadScriptFromFile
                    (fileName,&stack0xffffffffffffffb8,(UINT *)((long)&fileContents + 4),
                     (string *)0x0,false);
  HVar6 = HVar4;
  if (HVar4 < 0) goto LAB_001089f0;
  if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
    jsrtAttributes = jsrtAttributes | 0x8000000;
  }
  if (doTTRecord == 0) {
    if (doTTReplay != 0) {
      pPVar8 = PAL_get_stderr(0);
      pcVar13 = "!doTTReplay";
      pcVar10 = "Should be handled in the else case above!!!";
      uVar11 = 0x34e;
LAB_00108c8d:
      PAL_fprintf(pPVar8,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                  ,uVar11,pcVar13,pcVar10);
      pPVar8 = PAL_get_stderr(0);
      PAL_fflush(pPVar8);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateRuntime)
                      (jsrtAttributes,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
    if (JVar5 == JsNoError) {
      chRuntime = pvStack_38;
      if (HostConfigFlags::flags.DebugLaunch == true) {
        this = Debugger::GetDebugger(pvStack_38);
        Debugger::StartDebugging(this,pvStack_38);
      }
      local_158 = (JsContextRef)0x0;
      JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(pvStack_38,&local_158);
      if (JVar5 == JsNoError) {
        JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar5 == JsNoError) goto LAB_00108a92;
        goto LAB_001089b2;
      }
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar5);
      pcVar12 = 
      L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar5);
      pcVar12 = 
      L"ERROR: ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  else {
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateRecordRuntime)
                      (jsrtAttributes,false,(ulong)snapInterval,(ulong)snapHistoryLength,
                       Helpers::TTCreateStreamCallback,Helpers::TTWriteBytesToStreamCallback,
                       Helpers::TTFlushAndCloseStreamCallback,(JsThreadServiceCallback)0x0,
                       &stack0xffffffffffffffc8);
    if (JVar5 == JsNoError) {
      chRuntime = pvStack_38;
      local_158 = (JsContextRef)0x0;
      JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)(pvStack_38,true,&local_158);
      if (JVar5 == JsNoError) {
        JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar5 == JsNoError) {
          JVar5 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback)
                            (local_158,(void *)0x0,WScriptJsrt::JsContextBeforeCollectCallback);
          if (JVar5 == JsNoError) {
LAB_00108a92:
            if ((ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag != (_func_HRESULT_bool *)0x0
                & ChakraRTInterface::m_testHooksSetup) == 1) {
              (*ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag)(true);
            }
            bVar2 = WScriptJsrt::Initialize();
            HVar6 = -0x7fffbffb;
            if ((bVar2) &&
               (pcVar13 = fileName, pcVar10 = _fullpath((char *)&local_158,fileName,0x104),
               pcVar10 != (char *)0x0)) {
              if (HostConfigFlags::flags.TrackRejectedPromises == true) {
                pcVar13 = (char *)0x0;
                (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker)
                          (WScriptJsrt::PromiseRejectionTrackerCallback,(void *)0x0);
              }
              if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
                HVar6 = CreateLibraryByteCode(pCStack_48);
              }
              else if (HostConfigFlags::flags.SerializedIsEnabled == true) {
                CreateAndRunSerializedScript
                          (fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                           (char *)&local_158);
                HVar6 = HVar4;
              }
              else if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled == true) {
                CreateParserState(pCStack_48,(size_t)pcVar13,WScriptJsrt::FinalizeFree,(LPCWSTR)0x0)
                ;
                HVar6 = HVar4;
              }
              else if (HostConfigFlags::flags.UseParserStateCacheIsEnabled == true) {
                CreateParserStateAndRunScript
                          (fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                           (char *)&local_158);
                HVar6 = HVar4;
              }
              else {
                HVar6 = RunScript(fileName,pCStack_48,(ulong)fileContents._4_4_,
                                  WScriptJsrt::FinalizeFree,(JsValueRef)0x0,(char *)&local_158,
                                  (JsValueRef)0x0);
              }
            }
            goto LAB_001089f0;
          }
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar5);
          pcVar12 = 
          L"ERROR: ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback) failed. JsErrorCode=0x%x (%s)\n"
          ;
        }
        else {
LAB_001089b2:
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar5);
          pcVar12 = 
          L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
        }
      }
      else {
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar5);
        pcVar12 = 
        L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar5);
      pcVar12 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  PAL_fwprintf(pPVar8,pcVar12,(ulong)JVar5,pWVar9);
  pPVar8 = PAL_get_stderr(0);
  PAL_fflush(pPVar8);
LAB_001089f0:
  if (Debugger::debugger != (Debugger *)0x0) {
    Debugger::CompareOrWriteBaselineFile(Debugger::debugger,fileName);
    Debugger::CloseDebugger();
  }
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
  if (pvStack_38 != (JsRuntimeHandle)0x0) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(pvStack_38);
  }
  PAL__flushall();
  return HVar6;
}

Assistant:

HRESULT ExecuteTest(const char* fileName)
{
    HRESULT hr = S_OK;
    LPCSTR fileContents = nullptr;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    UINT lengthBytes = 0;

    if(strlen(fileName) >= 14 && strcmp(fileName + strlen(fileName) - 14, "ttdSentinal.js") == 0)
    {
#if !ENABLE_TTD
        wprintf(_u("Sentinel js file is only ok when in TTDebug mode!!!\n"));
        return E_FAIL;
#else
        if(!doTTReplay)
        {
            wprintf(_u("Sentinel js file is only ok when in TTReplay mode!!!\n"));
            return E_FAIL;
        }

        jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
        chRuntime = runtime;

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

        IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, nullptr, nullptr));

        unsigned int rcount = 0;
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(nullptr));
        ChakraRTInterface::JsRelease(context, &rcount);
        AssertMsg(rcount == 0, "Should only have had 1 ref from replay code and one ref from current context??");
#endif
    }
    else
    {
        LPCOLESTR contentsRaw = nullptr;

        char fullPath[_MAX_PATH];
        size_t len = 0;

        hr = Helpers::LoadScriptFromFile(fileName, fileContents, &lengthBytes);
        contentsRaw; lengthBytes; // Unused for now.

        IfFailGo(hr);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            jsrtAttributes = (JsRuntimeAttributes)(jsrtAttributes | JsRuntimeAttributeSerializeLibraryByteCode);
        }

#if ENABLE_TTD
        if (doTTRecord)
        {
            //Ensure we run with experimental features (as that is what Node does right now).
            jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
            chRuntime = runtime;

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

#if ENABLE_TTD
            //We need this here since this context is created in record
            IfJsErrorFailLog(ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback));
#endif
        }
        else
        {
            AssertMsg(!doTTReplay, "Should be handled in the else case above!!!");

            IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
            chRuntime = runtime;

            if (HostConfigFlags::flags.DebugLaunch)
            {
                Debugger* debugger = Debugger::GetDebugger(runtime);
                debugger->StartDebugging(runtime);
            }

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));

            //Don't need collect callback since this is always in replay

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
        }
#else
        IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
        chRuntime = runtime;

        if (HostConfigFlags::flags.DebugLaunch)
        {
            Debugger* debugger = Debugger::GetDebugger(runtime);
            debugger->StartDebugging(runtime);
        }

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
#endif

#ifdef DEBUG
        ChakraRTInterface::SetCheckOpHelpersFlag(true);
#endif

        if (!WScriptJsrt::Initialize())
        {
            IfFailGo(E_FAIL);
        }

        if (_fullpath(fullPath, fileName, _MAX_PATH) == nullptr)
        {
            IfFailGo(E_FAIL);
        }

        if (HostConfigFlags::flags.TrackRejectedPromises)
        {
            ChakraRTInterface::JsSetHostPromiseRejectionTracker(WScriptJsrt::PromiseRejectionTrackerCallback, nullptr);
        }
        
        len = strlen(fullPath);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            IfFailGo(CreateLibraryByteCode(fileContents));
        }
        else if (HostConfigFlags::flags.SerializedIsEnabled)
        {
            CreateAndRunSerializedScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled)
        {
            CreateParserState(fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr);
        }
        else if (HostConfigFlags::flags.UseParserStateCacheIsEnabled)
        {
            CreateParserStateAndRunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else
        {
            IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, fullPath, nullptr));
        }
    }
Error:
    if (Debugger::debugger != nullptr)
    {
        Debugger::debugger->CompareOrWriteBaselineFile(fileName);
        Debugger::CloseDebugger();
    }

    ChakraRTInterface::JsSetCurrentContext(nullptr);

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    _flushall();

    return hr;
}